

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.h
# Opt level: O1

bool __thiscall CChat::IsClientIgnored(CChat *this,int ClientID)

{
  int iVar1;
  CGameClient *pCVar2;
  byte bVar3;
  
  pCVar2 = (this->super_CComponent).m_pClient;
  bVar3 = 1;
  if ((((pCVar2->m_pConfig->m_ClShowsocial != 0) && (pCVar2->m_aClients[ClientID].m_Active == true))
      && (pCVar2->m_aClients[ClientID].m_ChatIgnore == false)) &&
     (iVar1 = pCVar2->m_pConfig->m_ClFilterchat, iVar1 != 2)) {
    bVar3 = 0;
    if ((iVar1 == 1) && (bVar3 = 0, pCVar2->m_LocalClientID != ClientID)) {
      bVar3 = pCVar2->m_aClients[ClientID].m_Friend ^ 1;
    }
  }
  return (bool)bVar3;
}

Assistant:

class CConfig *Config() const { return m_pClient->Config(); }